

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O0

Gia_Man_t * Gia_ManExtractWindow(Gia_Man_t *p,int LevelMax,int nTimeWindow,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Man_t *pWin;
  Vec_Int_t *vOuts;
  int fVerbose_local;
  int nTimeWindow_local;
  int LevelMax_local;
  Gia_Man_t *p_local;
  
  if ((LevelMax == 0) != (nTimeWindow == 0)) {
    p_00 = Gia_ManFindLatest(p,LevelMax,nTimeWindow);
    if (fVerbose != 0) {
      uVar1 = Vec_IntSize(p_00);
      printf("Collected %d outputs to extract.\n",(ulong)uVar1);
    }
    iVar2 = Vec_IntSize(p_00);
    if (iVar2 == 0) {
      Vec_IntFree(p_00);
      p_local = Gia_ManDup(p);
    }
    else {
      p_local = Gia_ManExtractWin(p,p_00,1);
      Vec_IntFree(p_00);
    }
    return p_local;
  }
  __assert_fail("!LevelMax != !nTimeWindow",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalMap.c"
                ,0xf0,"Gia_Man_t *Gia_ManExtractWindow(Gia_Man_t *, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManExtractWindow( Gia_Man_t * p, int LevelMax, int nTimeWindow, int fVerbose )
{
    Vec_Int_t * vOuts;
    Gia_Man_t * pWin;
    assert( !LevelMax != !nTimeWindow );
    vOuts = Gia_ManFindLatest( p, LevelMax, nTimeWindow );
    if ( fVerbose )
        printf( "Collected %d outputs to extract.\n", Vec_IntSize(vOuts) );
    if ( Vec_IntSize(vOuts) == 0 )
    {
        Vec_IntFree( vOuts );
        return Gia_ManDup( p );
    }
    pWin = Gia_ManExtractWin( p, vOuts, 1 );
    Vec_IntFree( vOuts );
    return pWin;
}